

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

void __thiscall Fl_Browser::lineposition(Fl_Browser *this,int line,Fl_Line_Position pos)

{
  int iVar1;
  int iVar2;
  int local_3c;
  int local_38;
  int H;
  int W;
  int Y;
  int X;
  int final;
  FL_BLINE *l;
  Fl_Line_Position local_18;
  int p;
  Fl_Line_Position pos_local;
  int line_local;
  Fl_Browser *this_local;
  
  p = line;
  if (line < 1) {
    p = 1;
  }
  if (this->lines < p) {
    p = this->lines;
  }
  l._4_4_ = 0;
  local_18 = pos;
  _pos_local = this;
  for (_X = this->first; _X != (FL_BLINE *)0x0 && 1 < p; _X = _X->next) {
    p = p + -1;
    iVar1 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                      (this,_X);
    l._4_4_ = iVar1 + l._4_4_;
  }
  if ((_X != (FL_BLINE *)0x0) && (local_18 == BOTTOM)) {
    iVar1 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                      (this,_X);
    l._4_4_ = iVar1 + l._4_4_;
  }
  Y = l._4_4_;
  Fl_Browser_::bbox(&this->super_Fl_Browser_,&W,&H,&local_38,&local_3c);
  if (local_18 != TOP) {
    if (local_18 == BOTTOM) {
      Y = Y - local_3c;
    }
    else if (local_18 == MIDDLE) {
      Y = Y - local_3c / 2;
    }
  }
  iVar1 = Y;
  iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0x16])();
  if (iVar2 - local_3c < iVar1) {
    iVar1 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0x16])();
    Y = iVar1 - local_3c;
  }
  Fl_Browser_::position(&this->super_Fl_Browser_,Y);
  return;
}

Assistant:

void Fl_Browser::lineposition(int line, Fl_Line_Position pos) {
  if (line<1) line = 1;
  if (line>lines) line = lines;
  int p = 0;

  FL_BLINE* l;
  for (l=first; l && line>1; l = l->next) {
    line--; p += item_height(l);
  }
  if (l && (pos == BOTTOM)) p += item_height (l);

  int final = p, X, Y, W, H;
  bbox(X, Y, W, H);

  switch(pos) {
    case TOP: break;
    case BOTTOM: final -= H; break;
    case MIDDLE: final -= H/2; break;
  }
  
  if (final > (full_height() - H)) final = full_height() -H;
  position(final);
}